

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::iteration_proxy_value
          (iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           *this,iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *it)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar1;
  allocator local_a;
  allocator local_9;
  
  (this->anchor).m_object = it->m_object;
  pbVar1 = (it->m_it).array_iterator._M_current;
  (this->anchor).m_it.object_iterator._M_node = (it->m_it).object_iterator._M_node;
  (this->anchor).m_it.array_iterator._M_current = pbVar1;
  (this->anchor).m_it.primitive_iterator.m_it = (it->m_it).primitive_iterator.m_it;
  this->array_index = 0;
  this->array_index_last = 0;
  std::__cxx11::string::string((string *)&this->array_index_str,"0",&local_9);
  std::__cxx11::string::string((string *)&this->empty_str,"",&local_a);
  return;
}

Assistant:

explicit iteration_proxy_value(IteratorType it) noexcept : anchor(it) {}